

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O2

int skipEscapedLineEnds(char *buffer,int buffer_len,int offset,int *lines)

{
  int iVar1;
  long lVar3;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)offset;
  while( true ) {
    iVar1 = (int)uVar2;
    lVar3 = (long)iVar1;
    if (((buffer_len <= (int)(lVar3 + 1)) || (buffer[lVar3] != '\\')) ||
       ((buffer[lVar3 + 1] != '\r' && (buffer[lVar3 + 1] != '\n')))) break;
    uVar2 = lVar3 + 2;
    *lines = *lines + 1;
    if ((((int)uVar2 < buffer_len) && (buffer[lVar3 + 1] == '\r')) && (buffer[uVar2] == '\n')) {
      uVar2 = (ulong)(iVar1 + 3);
    }
  }
  return iVar1;
}

Assistant:

static int skipEscapedLineEnds(const char *buffer, int buffer_len, int offset, int *lines)
{
    // Join physical lines to make logical lines, as in the C preprocessor
    while (offset + 1 < buffer_len
           && buffer[offset] == '\\'
           && qmake_endOfLine(buffer[offset + 1])) {
        offset += 2;
        ++*lines;
        if (offset < buffer_len
            && buffer[offset - 1] == '\r'
            && buffer[offset] == '\n') // CRLF
            offset++;
    }
    return offset;
}